

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O3

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,double len)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  uint uVar11;
  point_base<double> **pppVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double __y;
  double __x;
  double local_a8;
  undefined8 uStack_a0;
  double local_90;
  
  vc->m_size = 0;
  auVar17._0_8_ = v1->x - v0->x;
  auVar17._8_8_ = v1->y - v0->y;
  auVar18._8_4_ = SUB84(len,0);
  auVar18._0_8_ = len;
  auVar18._12_4_ = (int)((ulong)len >> 0x20);
  auVar18 = divpd(auVar17,auVar18);
  __y = this->m_width * auVar18._0_8_;
  __x = this->m_width * auVar18._8_8_;
  if (this->m_line_cap == round_cap) {
    dVar19 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
    iVar15 = (int)(3.141592653589793 / (dVar19 + dVar19));
    dVar19 = v0->x;
    dVar16 = v0->y;
    uVar11 = vc->m_size;
    uVar14 = uVar11 >> 6;
    if (vc->m_num_blocks <= uVar14) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
      uVar11 = vc->m_size;
    }
    dVar9 = 3.141592653589793 / (double)(iVar15 + 1);
    pdVar1 = (double *)((long)&vc->m_blocks[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
    *pdVar1 = dVar19 - __x;
    pdVar1[1] = dVar16 + __y;
    vc->m_size = uVar11 + 1;
    if (this->m_width_sign < 1) {
      local_90 = atan2(-__y,__x);
      if (0 < iVar15) {
        do {
          local_90 = local_90 - dVar9;
          local_a8 = v0->x;
          dVar16 = cos(local_90);
          dVar10 = this->m_width;
          uStack_a0._0_4_ = SUB84(v0->y,0);
          uStack_a0._4_4_ = (int)((ulong)v0->y >> 0x20);
          dVar6 = sin(local_90);
          dVar19 = this->m_width;
          uVar11 = vc->m_size;
          uVar14 = uVar11 >> 6;
          if (vc->m_num_blocks <= uVar14) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
            uVar11 = vc->m_size;
          }
          pdVar1 = (double *)((long)&vc->m_blocks[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
          *pdVar1 = dVar16 * dVar10 + local_a8;
          pdVar1[1] = dVar6 * dVar19 + uStack_a0;
          vc->m_size = uVar11 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    else {
      local_90 = atan2(__y,-__x);
      if (0 < iVar15) {
        do {
          local_90 = local_90 + dVar9;
          local_a8 = v0->x;
          dVar16 = cos(local_90);
          dVar10 = this->m_width;
          uStack_a0._0_4_ = SUB84(v0->y,0);
          uStack_a0._4_4_ = (int)((ulong)v0->y >> 0x20);
          dVar6 = sin(local_90);
          dVar19 = this->m_width;
          uVar11 = vc->m_size;
          uVar14 = uVar11 >> 6;
          if (vc->m_num_blocks <= uVar14) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
            uVar11 = vc->m_size;
          }
          pdVar1 = (double *)((long)&vc->m_blocks[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
          *pdVar1 = dVar16 * dVar10 + local_a8;
          pdVar1[1] = dVar6 * dVar19 + uStack_a0;
          vc->m_size = uVar11 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    uVar2 = v0->x;
    uVar3 = v0->y;
    uVar11 = vc->m_size;
    uVar14 = uVar11 >> 6;
    if (vc->m_num_blocks <= uVar14) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
      uVar11 = vc->m_size;
    }
    dVar19 = (double)uVar3 - __y;
    uStack_a0 = (double)uVar2 + __x;
  }
  else {
    dVar16 = 0.0;
    dVar19 = 0.0;
    if (this->m_line_cap == square_cap) {
      dVar16 = (double)this->m_width_sign * __y;
      dVar19 = (double)this->m_width_sign * __x;
    }
    dVar9 = (v0->x - __x) - dVar16;
    uStack_a0 = (v0->y + __y) - dVar19;
    uVar13 = vc->m_num_blocks;
    uVar11 = 0;
    if (uVar13 == 0) {
      auVar7._8_4_ = SUB84(uStack_a0,0);
      auVar7._0_8_ = dVar9;
      auVar7._12_4_ = (int)((ulong)uStack_a0 >> 0x20);
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
      uStack_a0 = auVar7._8_8_;
      uVar11 = vc->m_size;
      uVar13 = vc->m_num_blocks;
    }
    pppVar12 = vc->m_blocks;
    auVar8._8_4_ = SUB84(uStack_a0,0);
    auVar8._0_8_ = dVar9;
    auVar8._12_4_ = (int)((ulong)uStack_a0 >> 0x20);
    *(undefined1 (*) [16])((long)&(*pppVar12)->x + (ulong)((uVar11 & 0x3f) << 4)) = auVar8;
    uVar11 = uVar11 + 1;
    vc->m_size = uVar11;
    dVar19 = (v0->y - __y) - dVar19;
    uStack_a0 = (v0->x + __x) - dVar16;
    uVar14 = uVar11 >> 6;
    if (uVar14 < uVar13) goto LAB_0011c3ef;
    auVar4._8_4_ = SUB84(uStack_a0,0);
    auVar4._0_8_ = dVar19;
    auVar4._12_4_ = (int)((ulong)uStack_a0 >> 0x20);
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
    uStack_a0 = auVar4._8_8_;
    uVar11 = vc->m_size;
  }
  pppVar12 = vc->m_blocks;
LAB_0011c3ef:
  auVar5._8_4_ = SUB84(dVar19,0);
  auVar5._0_8_ = uStack_a0;
  auVar5._12_4_ = (int)((ulong)dVar19 >> 0x20);
  *(undefined1 (*) [16])((long)&pppVar12[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4)) = auVar5;
  vc->m_size = uVar11 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_cap(VC& vc,
                                   const vertex_dist& v0, 
                                   const vertex_dist& v1, 
                                   double len)
    {
        vc.remove_all();

        double dx1 = (v1.y - v0.y) / len;
        double dy1 = (v1.x - v0.x) / len;
        double dx2 = 0;
        double dy2 = 0;

        dx1 *= m_width;
        dy1 *= m_width;

        if(m_line_cap != round_cap)
        {
            if(m_line_cap == square_cap)
            {
                dx2 = dy1 * m_width_sign;
                dy2 = dx1 * m_width_sign;
            }
            add_vertex(vc, v0.x - dx1 - dx2, v0.y + dy1 - dy2);
            add_vertex(vc, v0.x + dx1 - dx2, v0.y - dy1 - dy2);
        }
        else
        {
            double da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;
            double a1;
            int i;
            int n = int(pi / da);

            da = pi / (n + 1);
            add_vertex(vc, v0.x - dx1, v0.y + dy1);
            if(m_width_sign > 0)
            {
                a1 = atan2(dy1, -dx1);
                a1 += da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 += da;
                }
            }
            else
            {
                a1 = atan2(-dy1, dx1);
                a1 -= da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 -= da;
                }
            }
            add_vertex(vc, v0.x + dx1, v0.y - dy1);
        }
    }